

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mu_test.c
# Opt level: O2

void benchmark_rmu_uncontended_waiter(testing t)

{
  nsync_mu *pnVar1;
  int iVar2;
  closure *cl;
  closure_t_waiter_1 a1;
  bool bVar3;
  int value;
  nsync_mu mu;
  undefined1 local_2c [20];
  
  iVar2 = testing_n(t);
  local_2c._0_4_ = 0;
  pnVar1 = (nsync_mu *)(local_2c + 4);
  nsync::nsync_mu_init(pnVar1);
  cl = closure_waiter((_func_void_closure_t_waiter_0_closure_t_waiter_1 *)pnVar1,
                      (closure_t_waiter_0)local_2c,a1);
  closure_fork(cl);
  nsync::nsync_mu_lock(pnVar1);
  nsync::nsync_mu_wait
            (pnVar1,int_is_1,(closure_t_waiter_0)local_2c,(_func_int_void_ptr_void_ptr *)0x0);
  nsync::nsync_mu_unlock(pnVar1);
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    nsync::nsync_mu_rlock(pnVar1);
    nsync::nsync_mu_runlock(pnVar1);
  }
  pnVar1 = (nsync_mu *)(local_2c + 4);
  nsync::nsync_mu_lock(pnVar1);
  local_2c._0_4_ = 2;
  nsync::nsync_mu_wait(pnVar1,int_is_3,local_2c,(_func_int_void_ptr_void_ptr *)0x0);
  nsync::nsync_mu_unlock(pnVar1);
  return;
}

Assistant:

static void benchmark_rmu_uncontended_waiter (testing t) {
	int i;
	int n = testing_n (t);
	nsync_mu mu;
	int value = 0;
	nsync_mu_init (&mu);
	closure_fork (closure_waiter (&waiter, &mu, &value));
	nsync_mu_lock (&mu);
	nsync_mu_wait (&mu, &int_is_1, &value, NULL);
	nsync_mu_unlock (&mu);
	for (i = 0; i != n; i++) {
		nsync_mu_rlock (&mu);
		nsync_mu_runlock (&mu);
	}
	nsync_mu_lock (&mu);
	value = 2;
	nsync_mu_wait (&mu, &int_is_3, &value, NULL);
	nsync_mu_unlock (&mu);
}